

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

int __thiscall jbcoin::Serializer::addEncoded(Serializer *this,int length)

{
  int iVar1;
  pointer puVar2;
  char *pcVar3;
  array<unsigned_char,_4UL> bytes;
  char local_c [3];
  char local_9;
  
  if (length < 0xc1) {
    pcVar3 = local_c + 1;
  }
  else if ((uint)length < 0x30c1) {
    pcVar3 = local_c + 2;
    length = length + -0xc1;
    local_c[0] = (char)((uint)length >> 8) + -0x3f;
  }
  else {
    if (0xe04d8 < (uint)length) {
      Throw<std::overflow_error,char_const(&)[7]>((char (*) [7])"lenlen");
    }
    pcVar3 = &local_9;
    length = length + -0x30c1;
    local_c[0] = (char)((uint)length >> 0x10) + -0xf;
    local_c[1] = (char)((uint)length >> 8);
  }
  pcVar3[-1] = (char)length;
  puVar2 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = *(int *)&(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,puVar2,local_c);
  return (int)puVar2 - iVar1;
}

Assistant:

int Serializer::addEncoded (int length)
{
    std::array<std::uint8_t, 4> bytes;
    int numBytes = 0;

    if (length <= 192)
    {
        bytes[0] = static_cast<unsigned char> (length);
        numBytes = 1;
    }
    else if (length <= 12480)
    {
        length -= 193;
        bytes[0] = 193 + static_cast<unsigned char> (length >> 8);
        bytes[1] = static_cast<unsigned char> (length & 0xff);
        numBytes = 2;
    }
    else if (length <= 918744)
    {
        length -= 12481;
        bytes[0] = 241 + static_cast<unsigned char> (length >> 16);
        bytes[1] = static_cast<unsigned char> ((length >> 8) & 0xff);
        bytes[2] = static_cast<unsigned char> (length & 0xff);
        numBytes = 3;
    }
    else Throw<std::overflow_error> ("lenlen");

    return addRaw (&bytes[0], numBytes);
}